

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reed_solomn_reconstruct.cpp
# Opt level: O2

vector<__int128,_std::allocator<__int128>_> * __thiscall
reed_solomn::poly_sub
          (vector<__int128,_std::allocator<__int128>_> *__return_storage_ptr__,reed_solomn *this,
          vector<__int128,_std::allocator<__int128>_> *A,
          vector<__int128,_std::allocator<__int128>_> *b)

{
  undefined1 a [16];
  undefined1 b_00 [16];
  pointer p_Var1;
  pointer p_Var2;
  long lVar3;
  reed_solomn *this_00;
  reed_solomn *this_01;
  int i;
  ulong uVar4;
  vector<__int128,_std::allocator<__int128>_> res;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  tmp;
  _func_int **pp_Var5;
  pointer p_Var6;
  pointer p_Var7;
  vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
  local_a0;
  ll128 *local_88 [2];
  _Vector_base<__int128,_std::allocator<__int128>_> local_78;
  _Vector_base<__int128,_std::allocator<__int128>_> local_60;
  _Vector_base<__int128,_std::allocator<__int128>_> local_48;
  
  this_01 = (reed_solomn *)&stack0xffffffffffffff38;
  pp_Var5 = (_func_int **)0x0;
  p_Var6 = (pointer)0x0;
  p_Var7 = (pointer)0x0;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&local_48,A);
  this_00 = (reed_solomn *)b;
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&local_60,b);
  poly_align(&local_a0,this_00,(vector<__int128,_std::allocator<__int128>_> *)&local_48,
             (vector<__int128,_std::allocator<__int128>_> *)&local_60);
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_60);
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_48);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (A,local_a0.
               super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  std::vector<__int128,_std::allocator<__int128>_>::operator=
            (b,local_a0.
               super__Vector_base<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1);
  p_Var1 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_start;
  p_Var2 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if ((long)p_Var2 - (long)p_Var1 ==
      (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(b->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
            super__Vector_impl_data._M_start) {
    lVar3 = 0;
    for (uVar4 = 0; uVar4 < (ulong)((long)p_Var2 - (long)p_Var1 >> 4); uVar4 = uVar4 + 1) {
      a._8_8_ = p_Var6;
      a._0_8_ = pp_Var5;
      b_00._8_8_ = __return_storage_ptr__;
      b_00._0_8_ = p_Var7;
      local_88[0] = base_sub((ll128 *)this,*(reed_solomn **)((long)p_Var1 + lVar3),(ll128)a,
                             (ll128)b_00);
      std::vector<__int128,_std::allocator<__int128>_>::emplace_back<__int128>
                ((vector<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffff38,
                 (__int128 *)local_88);
      p_Var1 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
               super__Vector_impl_data._M_start;
      p_Var2 = (A->super__Vector_base<__int128,_std::allocator<__int128>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      lVar3 = lVar3 + 0x10;
    }
    std::vector<__int128,_std::allocator<__int128>_>::vector
              ((vector<__int128,_std::allocator<__int128>_> *)&local_78,
               (vector<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffff38);
    poly_strip(__return_storage_ptr__,this_01,
               (vector<__int128,_std::allocator<__int128>_> *)&local_78);
    std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_78);
    std::
    vector<std::vector<__int128,_std::allocator<__int128>_>,_std::allocator<std::vector<__int128,_std::allocator<__int128>_>_>_>
    ::~vector(&local_a0);
    std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base
              ((_Vector_base<__int128,_std::allocator<__int128>_> *)&stack0xffffffffffffff38);
    return __return_storage_ptr__;
  }
  __assert_fail("A.size() == b.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/SMMLF[P]MPL-Public/malicious_lib/reed_solomn_reconstruct.cpp"
                ,0x96,"vector<ll128> reed_solomn::poly_sub(vector<ll128>, vector<ll128>)");
}

Assistant:

vector<ll128> reed_solomn::poly_sub(vector<ll128> A, vector<ll128> b) {
    vector<ll128> res;
    vector<vector<ll128>> tmp = poly_align(A, b);
    A = tmp[0];
    b = tmp[1];
    assert(A.size() == b.size());
    for (int i = 0; i < A.size(); ++i) {
        res.push_back(base_sub(A[i], b[i]));
    }
    return poly_strip(res);
}